

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O3

ssize_t __thiscall
LASreadItemCompressed_WAVEPACKET14_v4::read
          (LASreadItemCompressed_WAVEPACKET14_v4 *this,int __fd,void *__buf,size_t __nbytes)

{
  I32 pred;
  undefined8 uVar1;
  U32 UVar2;
  I32 IVar3;
  I32 IVar4;
  I32 IVar5;
  I32 IVar6;
  uint uVar7;
  ulong uVar8;
  U64 UVar9;
  undefined4 in_register_00000034;
  undefined8 *puVar10;
  U8 *item;
  
  puVar10 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  uVar8 = (ulong)this->current_context;
  item = this->contexts[uVar8].last_item;
  uVar7 = *__buf;
  if (this->current_context != uVar7) {
    this->current_context = uVar7;
    uVar8 = (ulong)uVar7;
    if (this->contexts[uVar7].unused == true) {
      createAndInitModelsAndDecompressors(this,uVar7,item);
      uVar8 = (ulong)this->current_context;
    }
    item = this->contexts[uVar8].last_item;
  }
  if (this->changed_wavepacket == true) {
    UVar2 = ArithmeticDecoder::decodeSymbol
                      (this->dec_wavepacket,this->contexts[uVar8].m_packet_index);
    *(char *)puVar10 = (char)UVar2;
    UVar9 = *(U64 *)(item + 1);
    uVar7 = *(uint *)(item + 9);
    IVar4 = *(I32 *)(item + 0xd);
    IVar5 = *(I32 *)(item + 0x11);
    IVar6 = *(I32 *)(item + 0x15);
    pred = *(I32 *)(item + 0x19);
    UVar2 = ArithmeticDecoder::decodeSymbol
                      (this->dec_wavepacket,
                       this->contexts[this->current_context].m_offset_diff
                       [this->contexts[this->current_context].sym_last_offset_diff]);
    uVar8 = (ulong)this->current_context;
    this->contexts[uVar8].sym_last_offset_diff = UVar2;
    if (UVar2 != 0) {
      if (UVar2 == 2) {
        IVar3 = IntegerCompressor::decompress
                          (this->contexts[uVar8].ic_offset_diff,this->contexts[uVar8].last_diff_32,0
                          );
        uVar8 = (ulong)this->current_context;
        this->contexts[uVar8].last_diff_32 = IVar3;
        UVar9 = UVar9 + (long)IVar3;
      }
      else if (UVar2 == 1) {
        UVar9 = UVar9 + uVar7;
      }
      else {
        UVar9 = ArithmeticDecoder::readInt64(this->dec_wavepacket);
        uVar8 = (ulong)this->current_context;
      }
    }
    IVar3 = IntegerCompressor::decompress(this->contexts[uVar8].ic_packet_size,uVar7,0);
    IVar4 = IntegerCompressor::decompress
                      (this->contexts[this->current_context].ic_return_point,IVar4,0);
    IVar5 = IntegerCompressor::decompress(this->contexts[this->current_context].ic_xyz,IVar5,0);
    IVar6 = IntegerCompressor::decompress(this->contexts[this->current_context].ic_xyz,IVar6,1);
    uVar7 = IntegerCompressor::decompress(this->contexts[this->current_context].ic_xyz,pred,2);
    *(char *)((long)puVar10 + 1) = (char)UVar9;
    *(char *)((long)puVar10 + 2) = (char)(UVar9 >> 8);
    *(char *)((long)puVar10 + 3) = (char)(UVar9 >> 0x10);
    *(char *)((long)puVar10 + 4) = (char)(UVar9 >> 0x18);
    *(char *)((long)puVar10 + 5) = (char)(UVar9 >> 0x20);
    *(char *)((long)puVar10 + 6) = (char)(UVar9 >> 0x28);
    *(char *)((long)puVar10 + 7) = (char)(UVar9 >> 0x30);
    *(char *)(puVar10 + 1) = (char)(UVar9 >> 0x38);
    *(char *)((long)puVar10 + 9) = (char)IVar3;
    *(char *)((long)puVar10 + 10) = (char)((uint)IVar3 >> 8);
    *(char *)((long)puVar10 + 0xb) = (char)((uint)IVar3 >> 0x10);
    *(char *)((long)puVar10 + 0xc) = (char)((uint)IVar3 >> 0x18);
    *(char *)((long)puVar10 + 0xd) = (char)IVar4;
    *(char *)((long)puVar10 + 0xe) = (char)((uint)IVar4 >> 8);
    *(char *)((long)puVar10 + 0xf) = (char)((uint)IVar4 >> 0x10);
    *(char *)(puVar10 + 2) = (char)((uint)IVar4 >> 0x18);
    *(char *)((long)puVar10 + 0x11) = (char)IVar5;
    *(char *)((long)puVar10 + 0x12) = (char)((uint)IVar5 >> 8);
    *(char *)((long)puVar10 + 0x13) = (char)((uint)IVar5 >> 0x10);
    *(char *)((long)puVar10 + 0x14) = (char)((uint)IVar5 >> 0x18);
    *(char *)((long)puVar10 + 0x15) = (char)IVar6;
    *(char *)((long)puVar10 + 0x16) = (char)((uint)IVar6 >> 8);
    *(char *)((long)puVar10 + 0x17) = (char)((uint)IVar6 >> 0x10);
    *(char *)(puVar10 + 3) = (char)((uint)IVar6 >> 0x18);
    *(char *)((long)puVar10 + 0x19) = (char)uVar7;
    *(char *)((long)puVar10 + 0x1a) = (char)(uVar7 >> 8);
    *(char *)((long)puVar10 + 0x1b) = (char)(uVar7 >> 0x10);
    uVar8 = (ulong)(uVar7 >> 0x18);
    *(char *)((long)puVar10 + 0x1c) = (char)(uVar7 >> 0x18);
    uVar1 = puVar10[1];
    *(undefined8 *)item = *puVar10;
    *(undefined8 *)(item + 8) = uVar1;
    uVar1 = *(undefined8 *)((long)puVar10 + 0x15);
    *(undefined8 *)(item + 0xd) = *(undefined8 *)((long)puVar10 + 0xd);
    *(undefined8 *)(item + 0x15) = uVar1;
  }
  return uVar8;
}

Assistant:

inline void LASreadItemCompressed_WAVEPACKET14_v4::read(U8* item, U32& context)
{
  // get last

  U8* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 reader
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndDecompressors(current_context, last_item);
    }
    last_item = contexts[current_context].last_item;
  }

  // decompress

  if (changed_wavepacket)
  {
    item[0] = (U8)(dec_wavepacket->decodeSymbol(contexts[current_context].m_packet_index));

    LASwavepacket13 this_item_m;
    LASwavepacket13 last_item_m = LASwavepacket13::unpack(last_item+1);

    contexts[current_context].sym_last_offset_diff = dec_wavepacket->decodeSymbol(contexts[current_context].m_offset_diff[contexts[current_context].sym_last_offset_diff]);

    if (contexts[current_context].sym_last_offset_diff == 0)
    {
      this_item_m.offset = last_item_m.offset;
    }
    else if (contexts[current_context].sym_last_offset_diff == 1)
    {
      this_item_m.offset = last_item_m.offset + last_item_m.packet_size;
    }
    else if (contexts[current_context].sym_last_offset_diff == 2)
    {
      contexts[current_context].last_diff_32 = contexts[current_context].ic_offset_diff->decompress(contexts[current_context].last_diff_32);
      this_item_m.offset = last_item_m.offset + contexts[current_context].last_diff_32;
    }
    else
    {
      this_item_m.offset = dec_wavepacket->readInt64();
    }

    this_item_m.packet_size = contexts[current_context].ic_packet_size->decompress(last_item_m.packet_size);
    this_item_m.return_point.i32 = contexts[current_context].ic_return_point->decompress(last_item_m.return_point.i32);
    this_item_m.x.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.x.i32, 0);
    this_item_m.y.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.y.i32, 1);
    this_item_m.z.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.z.i32, 2);

    this_item_m.pack(item+1);

    memcpy(last_item, item, 29);
  }
}